

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O0

QuadRule * lf::quad::make_QuadRule(QuadRule *__return_storage_ptr__,RefEl ref_el,uint degree)

{
  RefElType RVar1;
  RefElType RVar2;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  runtime_error *this_00;
  QuadRule *pQVar3;
  undefined7 uVar4;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *b;
  MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
  *b_00;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  stringstream local_640 [8];
  stringstream ss;
  ostream local_630 [376];
  KroneckerProductBase<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_4b8;
  VectorXd local_4a8;
  Matrix<double,__1,__1,_0,__1,__1> local_498;
  RefEl local_479;
  RowXpr local_478;
  non_const_type local_440;
  Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1> local_438;
  RowXpr local_420;
  non_const_type local_3e8;
  NestedExpressionType local_3e0;
  int local_3d4;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_3d0;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
  local_3a0;
  non_const_type local_370;
  KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
  local_368;
  uint local_330 [2];
  undefined1 local_328 [8];
  MatrixXd points2d_1;
  Scalar local_308;
  NestedExpressionType local_300;
  double local_2f8;
  int local_2ec;
  NestedExpressionType local_2e8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_2e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_2b8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_268;
  type *jac_w;
  type *jac_p;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_238;
  type *leg_w;
  type *leg_p;
  uint local_208;
  RefEl local_201;
  quadDegree_t n_2;
  Nested local_1f8;
  VectorXd local_1f0;
  Matrix<double,__1,__1,_0,__1,__1> local_1e0;
  RefEl local_1c1;
  RowXpr local_1c0;
  non_const_type local_188;
  Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1> local_180;
  RowXpr local_168;
  ConstantReturnType local_130;
  non_const_type local_118;
  KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_110;
  uint local_f0 [2];
  undefined1 local_e8 [8];
  MatrixXd points2d;
  type *weights1d;
  type *points1d;
  uint local_a0;
  RefEl local_99;
  quadDegree_t n_1;
  non_const_type local_88;
  MatrixXd local_80;
  RefEl local_51;
  __tuple_element_t<1UL,_tuple<Matrix<double,__1,_1,_0,__1,_1>,_Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_50;
  type *weights;
  type *points;
  uint local_20;
  RefEl local_19;
  quadDegree_t n;
  RefEl local_11;
  uint degree_local;
  RefEl ref_el_local;
  
  pQVar3 = __return_storage_ptr__;
  n = degree;
  local_11.type_ = ref_el.type_;
  _degree_local = __return_storage_ptr__;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_11);
  local_19 = lf::base::RefEl::kSegment();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_19);
  uVar4 = (undefined7)((ulong)pQVar3 >> 8);
  if (RVar1 == RVar2) {
    local_20 = (n >> 1) + 1;
    GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&points,local_20);
    weights = std::get<0ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)&points);
    local_50 = std::get<1ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)&points);
    local_51 = lf::base::RefEl::kSegment();
    local_88 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)weights);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_80,
               (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_88);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&n_1,local_50)
    ;
    QuadRule::QuadRule(__return_storage_ptr__,local_51,&local_80,
                       (Matrix<double,__1,_1,_0,__1,_1> *)&n_1,local_20 * 2 - 1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&n_1);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_80);
    std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
    ~tuple((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *
           )&points);
  }
  else {
    RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_11);
    local_99 = lf::base::RefEl::kQuad();
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_99);
    b = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         *)CONCAT71(uVar4,RVar2);
    if (RVar1 == RVar2) {
      local_a0 = (n >> 1) + 1;
      GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&points1d,local_a0);
      this = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::get<0ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&points1d);
      points2d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)std::get<1ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                            ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)&points1d);
      local_f0[1] = 2;
      local_f0[0] = local_a0 * local_a0;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_e8,(int *)(local_f0 + 1),local_f0);
      local_118 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(this);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Ones
                (&local_130,1,(ulong)local_a0);
      Eigen::
      kroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                (&local_110,(Eigen *)&local_118,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_130,b);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_168,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e8,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
                 &local_168,
                 (ReturnByValue<Eigen::KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_110);
      local_188 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(this);
      Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::replicate
                (&local_180,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_188
                 ,1,(ulong)local_a0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_1c0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e8,1);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_1c0,
                 (DenseBase<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1>_>
                  *)&local_180);
      local_1c1 = lf::base::RefEl::kQuad();
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                (&local_1e0,(Matrix<double,__1,__1,_0,__1,__1> *)local_e8);
      _n_2 = (KroneckerProductBase<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              )Eigen::
               kroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          points2d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          points2d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_1f0,
                 (EigenBase<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&n_2);
      QuadRule::QuadRule(__return_storage_ptr__,local_1c1,&local_1e0,&local_1f0,local_a0 * 2 - 1);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_1f0);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1e0);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_e8);
      std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
      ~tuple((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&points1d);
    }
    else {
      RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_11);
      local_201 = lf::base::RefEl::kTria();
      RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_201);
      if (RVar1 != RVar2) {
        std::__cxx11::stringstream::stringstream(local_640);
        std::operator<<(local_630,"No Quadrature rules implemented for this reference element yet.")
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"false",&local_661);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/make_quad_rule.cc"
                   ,&local_689);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_660,&local_688,0x9c,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        std::__cxx11::string::~string((string *)&local_660);
        std::allocator<char>::~allocator(&local_661);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"this code should not be reached");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b_00 = (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)(ulong)(n - 1);
      switch(b_00) {
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x0:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,1>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,2>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2:
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x3:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,4>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x4:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,5>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x5:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,6>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x6:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,7>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x7:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,8>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x8:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,9>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x9:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,10>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xa:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,11>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xb:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,12>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xc:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,13>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xd:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,14>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xe:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,15>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0xf:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,16>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x10:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,17>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x11:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,18>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x12:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,19>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x13:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,20>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x14:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,21>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x15:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,22>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x16:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,23>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x17:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,24>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x18:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,25>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x19:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,26>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1a:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,27>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1b:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,28>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1c:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,29>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1d:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,30>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1e:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,31>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x1f:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,32>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x20:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,33>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x21:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,34>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x22:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,35>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x23:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,36>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x24:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,37>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x25:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,38>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x26:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,39>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x27:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,40>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x28:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,41>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x29:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,42>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2a:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,43>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2b:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,44>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2c:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,45>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2d:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,46>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2e:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,47>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x2f:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,48>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x30:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,49>();
        break;
      case (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
            *)0x31:
        detail::HardcodedQuadRule<(lf::base::RefElType)3,50>();
        break;
      default:
        local_208 = (n >> 1) + 1;
        GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&leg_p,local_208);
        leg_w = std::get<0ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)&leg_p);
        local_238 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                    std::
                    get<1ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&leg_p);
        GaussJacobi((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&jac_p,local_208,1.0,0.0);
        jac_w = std::get<0ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)&jac_p);
        local_268 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                    std::
                    get<1ul,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&jac_p);
        local_2e8 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)jac_w);
        local_2ec = 1;
        Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator+
                  (&local_2e0,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_2e8,
                   &local_2ec);
        local_2f8 = 2.0;
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
        ::operator/(&local_2b8,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
                     *)&local_2e0,&local_2f8);
        local_300 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)jac_w);
        Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                  ((ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_300,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_2b8);
        local_308 = 0.25;
        points2d_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = (Index)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array(local_268);
        Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::operator*=
                  ((DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                   &points2d_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,&local_308);
        local_330[1] = 2;
        local_330[0] = local_208 * local_208;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_328,(int *)(local_330 + 1),local_330);
        local_370 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)leg_w);
        local_3d4 = 1;
        local_3e8 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)jac_w);
        local_3e0.m_matrix =
             (non_const_type)
             Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                        &local_3e8);
        Eigen::operator-(&local_3d0,&local_3d4,(StorageBaseType *)&local_3e0);
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>
        ::matrix(&local_3a0,
                 (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                  *)&local_3d0);
        Eigen::
        kroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>const>const>>
                  (&local_368,(Eigen *)&local_370,
                   (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                   &local_3a0,b_00);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_420,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_328,0);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
                   &local_420,
                   (ReturnByValue<Eigen::KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>_>
                    *)&local_368);
        local_440 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)jac_w);
        Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::replicate
                  (&local_438,
                   (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                   &local_440,1,(ulong)local_208);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_478,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_328,1);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_478,
                   (DenseBase<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1>_>
                    *)&local_438);
        local_479 = lf::base::RefEl::kTria();
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                  (&local_498,(Matrix<double,__1,__1,_0,__1,__1> *)local_328);
        local_4b8 = (KroneckerProductBase<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     )Eigen::
                      kroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                                (local_238,local_268);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_4a8,
                   (EigenBase<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_4b8);
        QuadRule::QuadRule(__return_storage_ptr__,local_479,&local_498,&local_4a8,local_208 * 2 - 1)
        ;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_4a8);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_498);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_328);
        std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::~tuple((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&jac_p);
        std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::~tuple((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&leg_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QuadRule make_QuadRule(base::RefEl ref_el, unsigned degree) {
  if (ref_el == base::RefEl::kSegment()) {
    const quadDegree_t n = degree / 2 + 1;
    auto [points, weights] = GaussLegendre(n);
    return QuadRule(base::RefEl::kSegment(), points.transpose(),
                    std::move(weights), 2 * n - 1);
  }
  if (ref_el == base::RefEl::kQuad()) {
    const quadDegree_t n = degree / 2 + 1;
    auto [points1d, weights1d] = GaussLegendre(n);
    Eigen::MatrixXd points2d(2, n * n);
    points2d.row(0) = Eigen::kroneckerProduct(points1d.transpose(),
                                              Eigen::MatrixXd::Ones(1, n));
    points2d.row(1) = points1d.transpose().replicate(1, n);
    return QuadRule(base::RefEl::kQuad(), std::move(points2d),
                    Eigen::kroneckerProduct(weights1d, weights1d), 2 * n - 1);
  }
  if (ref_el == base::RefEl::kTria()) {
    switch (degree) {
      case 1:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 1>();
      case 2:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 2>();
      case 3:  // use degree 4 rule instead
      case 4:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 4>();
      case 5:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 5>();
      case 6:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 6>();
      case 7:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 7>();
      case 8:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 8>();
      case 9:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 9>();
      case 10:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 10>();
      case 11:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 11>();
      case 12:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 12>();
      case 13:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 13>();
      case 14:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 14>();
      case 15:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 15>();
      case 16:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 16>();
      case 17:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 17>();
      case 18:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 18>();
      case 19:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 19>();
      case 20:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 20>();
      case 21:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 21>();
      case 22:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 22>();
      case 23:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 23>();
      case 24:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 24>();
      case 25:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 25>();
      case 26:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 26>();
      case 27:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 27>();
      case 28:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 28>();
      case 29:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 29>();
      case 30:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 30>();
      case 31:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 31>();
      case 32:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 32>();
      case 33:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 33>();
      case 34:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 34>();
      case 35:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 35>();
      case 36:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 36>();
      case 37:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 37>();
      case 38:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 38>();
      case 39:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 39>();
      case 40:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 40>();
      case 41:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 41>();
      case 42:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 42>();
      case 43:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 43>();
      case 44:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 44>();
      case 45:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 45>();
      case 46:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 46>();
      case 47:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 47>();
      case 48:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 48>();
      case 49:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 49>();
      case 50:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 50>();
      default:
        // Create a quadrule using tensor product quadrature rule + duffy
        // transform
        const quadDegree_t n = degree / 2 + 1;
        auto [leg_p, leg_w] = GaussLegendre(n);
        auto [jac_p, jac_w] = GaussJacobi(n, 1, 0);
        jac_p.array() = (jac_p.array() + 1) / 2.;  // rescale to [0,1]
        jac_w.array() *= 0.25;
        Eigen::MatrixXd points2d(2, n * n);
        points2d.row(0) = Eigen::kroneckerProduct(
            leg_p.transpose(), (1 - jac_p.transpose().array()).matrix());
        points2d.row(1) = jac_p.transpose().replicate(1, n);
        return QuadRule(base::RefEl::kTria(), std::move(points2d),
                        Eigen::kroneckerProduct(leg_w, jac_w), 2 * n - 1);
    }
  }
  LF_VERIFY_MSG(
      false, "No Quadrature rules implemented for this reference element yet.");
}